

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O1

bool Memory::
     SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
     RescanObjectsOnPage(SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *block,
                        char *pageAddress,char *blockStartAddress,
                        BVStatic<2048UL> *heapBlockMarkBits,uint localObjectSize,uint bucketIndex,
                        bool *anyObjectRescanned,Recycler *recycler)

{
  MarkData *pMVar1;
  size_t *psVar2;
  ushort uVar3;
  Recycler *pRVar4;
  code *pcVar5;
  bool bVar6;
  BOOLEAN BVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined4 *puVar13;
  char *pcVar14;
  uint pageStartBitIndex;
  char *error;
  ulong uVar15;
  uint bitIndex;
  BVIndex BVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  bool bVar21;
  MarkCandidate item;
  
  pMVar1 = &(recycler->collectionStats).markData;
  pMVar1->rescanPageCount = pMVar1->rescanPageCount + 8;
  if (heapBlockMarkBits->data[0].word == 0) {
    uVar15 = 0;
    do {
      uVar19 = uVar15;
      if (uVar19 == 0x1f) break;
      uVar15 = uVar19 + 1;
    } while (heapBlockMarkBits->data[uVar19 + 1].word == 0);
    if (0x1e < uVar19) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,100,"(!heapBlockMarkBits->IsAllClear())",
                         "!heapBlockMarkBits->IsAllClear()");
      if (!bVar6) goto LAB_0074e640;
      *puVar13 = 0;
    }
  }
  if (anyObjectRescanned != (bool *)0x0) {
    *anyObjectRescanned = false;
  }
  uVar15 = (long)pageAddress - (long)blockStartAddress;
  if (0x7fff < uVar15) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x6b,
                       "((char*)pageAddress - blockStartAddress < TBlockAttributes::PageCount * AutoSystemInfo::PageSize)"
                       ,
                       "(char*)pageAddress - blockStartAddress < TBlockAttributes::PageCount * AutoSystemInfo::PageSize"
                      );
    if (!bVar6) goto LAB_0074e640;
    *puVar13 = 0;
  }
  uVar19 = (uVar15 & 0xffffffff) / (ulong)localObjectSize;
  uVar18 = (uint)uVar19;
  pcVar14 = blockStartAddress + uVar18 * localObjectSize;
  if (((ulong)pcVar14 & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                       ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                       "HeapInfo::IsAlignedAddress(objectAddress)");
    if (!bVar6) goto LAB_0074e640;
    *puVar13 = 0;
  }
  if (0xfffefff < (uint)uVar15) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x77,"(pageByteOffset / AutoSystemInfo::PageSize < (32767 * 2 + 1))",
                       "pageByteOffset / AutoSystemInfo::PageSize < USHRT_MAX");
    if (!bVar6) goto LAB_0074e640;
    *puVar13 = 0;
  }
  uVar9 = HeapInfo::GetMediumBucketIndex((ulong)localObjectSize);
  if (0x1c < uVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,400,"(index < TBlockAttributes::BucketCount)",
                       "index < TBlockAttributes::BucketCount");
    if (!bVar6) goto LAB_0074e640;
    *puVar13 = 0;
  }
  pageStartBitIndex = (uint)(uVar15 >> 4) & 0xfffffff;
  uVar15 = uVar15 >> 0xc & 0xffff;
  uVar10 = SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::CalculateMarkCountForPage
                     (heapBlockMarkBits,bucketIndex,pageStartBitIndex);
  uVar3 = *(ushort *)((ulong)uVar9 * 0x20 + 0x1620682 + uVar15 * 4);
  if (0x8000 / localObjectSize <= uVar18) {
    ReportFatalException(0,-0x7fffbffb,Fatal_Recycler_MemoryCorruption,3);
  }
  bVar6 = SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::CanRescanFullBlock();
  if ((bVar6) && (uVar10 == uVar3)) {
    if ((recycler->collectionState).value == CollectionStateParallelMark) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                         ,0x206,"(this->collectionState != CollectionStateParallelMark)",
                         "this->collectionState != CollectionStateParallelMark");
      if (!bVar6) goto LAB_0074e640;
      *puVar13 = 0;
    }
    if (pageAddress == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.inl"
                         ,9,"(objectAddress != nullptr)","objectAddress != nullptr");
      if (!bVar6) goto LAB_0074e640;
      *puVar13 = 0;
    }
    pRVar4 = (recycler->markContext).recycler;
    if ((pRVar4->forceTraceMark != false) ||
       (bVar6 = Js::Phases::IsEnabled(&pRVar4->recyclerFlagsTable->Trace,MarkPhase), bVar6)) {
      Output::Print(L" %p",pageAddress);
    }
    LOCK();
    psVar2 = &(((recycler->markContext).recycler)->collectionStats).scanCount;
    *(int *)psVar2 = (int)*psVar2 + 1;
    UNLOCK();
    item.byteCount = 0x1000;
    item.obj = (void **)pageAddress;
    bVar6 = PageStack<Memory::MarkContext::MarkCandidate>::Push
                      (&(recycler->markContext).markStack,item);
    if (!bVar6) {
      return false;
    }
    psVar2 = &(recycler->collectionStats).markData.rescanObjectCount;
    *psVar2 = *psVar2 + (ulong)(uint)uVar3;
    psVar2 = &(recycler->collectionStats).markData.rescanObjectByteCount;
    *psVar2 = *psVar2 + (ulong)(localObjectSize * uVar3);
    bVar8 = true;
    goto joined_r0x0074e635;
  }
  BVar16 = (uint)((ulong)pcVar14 >> 4) & 0x7ff;
  if (pcVar14 == pageAddress) {
    bVar6 = true;
  }
  else {
    if (pcVar14 < blockStartAddress || pageAddress <= pcVar14) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x9f,
                         "(startObjectAddress >= blockStartAddress && startObjectAddress < pageAddress)"
                         ,
                         "startObjectAddress >= blockStartAddress && startObjectAddress < pageAddress"
                        );
      if (!bVar6) goto LAB_0074e640;
      *puVar13 = 0;
    }
    BVar7 = BVStatic<2048UL>::Test(heapBlockMarkBits,BVar16);
    bVar6 = BVar7 != '\x01';
    uVar10 = uVar10 + (BVar7 == '\x01');
  }
  uVar11 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetObjectBitDeltaForBucketIndex
                     (bucketIndex);
  bVar8 = false;
  bVar21 = uVar10 == 0;
  if (!bVar21) {
    uVar20 = 0;
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      uVar18 = (uint)uVar19;
      if (0x8000 / localObjectSize <= uVar18) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                           ,0xae,"(objectIndex < localObjectCount)","objectIndex < localObjectCount"
                          );
        if (!bVar8) goto LAB_0074e640;
        *puVar13 = 0;
      }
      if (0x1c < bucketIndex) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                           ,0x186,"(index < TBlockAttributes::BucketCount)",
                           "index < TBlockAttributes::BucketCount");
        if (!bVar8) goto LAB_0074e640;
        *puVar13 = 0;
      }
      BVar7 = BVStatic<2048UL>::Test
                        (HeapInfo::mediumAllocValidPointersMap.invalidBitsBuffers + bucketIndex,
                         BVar16);
      if (BVar7 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                           ,0xaf,
                           "(!HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex)->Test(bitIndex))"
                           ,
                           "!HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex)->Test(bitIndex)"
                          );
        if (!bVar8) goto LAB_0074e640;
        *puVar13 = 0;
      }
      BVar7 = BVStatic<2048UL>::Test(heapBlockMarkBits,BVar16);
      if (BVar7 != '\0') {
        bVar8 = SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::RescanObject
                          (block,blockStartAddress + uVar18 * localObjectSize,localObjectSize,uVar18
                           ,recycler);
        uVar20 = uVar20 + bVar8;
        if (!bVar8) break;
      }
      uVar18 = uVar18 + 1;
      uVar19 = (ulong)uVar18;
      BVar16 = BVar16 + uVar11;
      bVar21 = uVar20 >= uVar10;
    } while (uVar20 < uVar10);
    bVar8 = uVar20 != 0;
  }
  if (!bVar21) {
    return bVar21;
  }
  uVar12 = SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::CalculateMarkCountForPage
                     (heapBlockMarkBits,bucketIndex,pageStartBitIndex);
  if (pcVar14 == pageAddress || bVar6) {
    if (uVar10 != uVar12) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      error = 
      "(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex))"
      ;
      pcVar14 = 
      "rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex)"
      ;
      uVar10 = 0xc5;
LAB_0074e56d:
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,uVar10,error,pcVar14);
      if (!bVar6) {
LAB_0074e640:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar13 = 0;
    }
  }
  else if (uVar10 != uVar12 + 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    error = 
    "(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex) + 1)"
    ;
    pcVar14 = 
    "rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex) + 1"
    ;
    uVar10 = 0xc1;
    goto LAB_0074e56d;
  }
  lVar17 = (ulong)uVar9 * 0x20 + 0x1620680;
  uVar18 = uVar18 + 1;
  if (uVar18 < *(ushort *)(lVar17 + uVar15 * 4)) {
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    BVar16 = uVar11 * uVar18;
    do {
      BVar7 = BVStatic<2048UL>::Test(heapBlockMarkBits,BVar16);
      if (BVar7 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                           ,0xcd,"(!heapBlockMarkBits->Test(i * objectBitDelta))",
                           "!heapBlockMarkBits->Test(i * objectBitDelta)");
        if (!bVar6) goto LAB_0074e640;
        *puVar13 = 0;
      }
      uVar18 = uVar18 + 1;
      BVar16 = BVar16 + uVar11;
    } while (uVar18 < *(ushort *)(lVar17 + uVar15 * 4));
  }
joined_r0x0074e635:
  if (anyObjectRescanned != (bool *)0x0) {
    *anyObjectRescanned = bVar8;
  }
  return true;
}

Assistant:

bool
SmallNormalHeapBucketBase<TBlockType>::RescanObjectsOnPage(TBlockType * block, char* pageAddress, char * blockStartAddress, BVStatic<TBlockAttributes::BitVectorCount> * heapBlockMarkBits, const uint localObjectSize, uint bucketIndex, __out_opt bool* anyObjectRescanned, Recycler * recycler)
{
    RECYCLER_STATS_ADD(recycler, markData.rescanPageCount, TBlockAttributes::PageCount);

    // By the time we get here, we should have ensured that there's a mark on any page somewhere.
    // REVIEW: Worth check on just the page's mark bits?
    Assert(!heapBlockMarkBits->IsAllClear());

    if (anyObjectRescanned != nullptr)
    {
        *anyObjectRescanned = false;
    }

    Assert((char*)pageAddress - blockStartAddress < TBlockAttributes::PageCount * AutoSystemInfo::PageSize);
    const uint pageByteOffset = static_cast<uint>((char*)pageAddress - blockStartAddress);
    uint firstObjectOnPageIndex = pageByteOffset / localObjectSize;

    // This is not necessarily the address on the first object that starts on the page
    // If the last object on the previous page spans two pages, this is the address of that object
    // We do it this way so that we can figure out if we need to rescan the first few bytes of the page
    // if the actual first object on this page is not located at the start of the page
    char* const startObjectAddress = blockStartAddress + (firstObjectOnPageIndex * localObjectSize);
    const uint startBitIndex = TBlockType::GetAddressBitIndex(startObjectAddress);
    const uint pageStartBitIndex = pageByteOffset >> HeapConstants::ObjectAllocationShift;

    Assert(pageByteOffset / AutoSystemInfo::PageSize < USHRT_MAX);
    const ushort pageNumber = static_cast<const ushort>(pageByteOffset / AutoSystemInfo::PageSize);
    const typename TBlockType::BlockInfo& blockInfoForPage = HeapInfo::GetBlockInfo<TBlockAttributes>(localObjectSize)[pageNumber];

    bool lastObjectOnPreviousPageMarked = false;
    // Calculate the mark count here since we no longer keep track during marking
    uint rescanMarkCount = TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex);
    const uint pageObjectCount = blockInfoForPage.pageObjectCount;
    const uint localObjectCount = (TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / localObjectSize;

    // With protected unallocatable ending pages and reset writewatch, we should never be scanning on these pages.
    if (firstObjectOnPageIndex >= localObjectCount)
    {
        ReportFatalException(NULL, E_FAIL, Fatal_Recycler_MemoryCorruption, 3);
    }

    // If all objects are marked, rescan whole block at once
    if (TBlockType::CanRescanFullBlock() && rescanMarkCount == pageObjectCount)
    {
        // REVIEW: Can we optimize this more?
        if (!recycler->AddMark(pageAddress, AutoSystemInfo::PageSize))
        {
            // Failed to add to the mark stack due to OOM.
            return false;
        }

        RECYCLER_STATS_ADD(recycler, markData.rescanObjectCount, pageObjectCount);
        RECYCLER_STATS_ADD(recycler, markData.rescanObjectByteCount, localObjectSize * pageObjectCount);
        if (anyObjectRescanned != nullptr)
        {
            *anyObjectRescanned = true;
        }

        return true;
    }

    if (startObjectAddress != pageAddress)
    {
        // If the last object on the previous page that spans into the current page is marked,
        // we need to count that in the markCount for rescan
        Assert(startObjectAddress >= blockStartAddress && startObjectAddress < pageAddress);
        lastObjectOnPreviousPageMarked = (heapBlockMarkBits->Test(startBitIndex) == TRUE);
        if (lastObjectOnPreviousPageMarked)
        {
            rescanMarkCount++;
        }
    }

    const uint objectBitDelta = SmallHeapBlockT<TBlockAttributes>::GetObjectBitDeltaForBucketIndex(bucketIndex);

    uint rescanCount = 0;
    uint objectIndex = firstObjectOnPageIndex;

    for (uint bitIndex = startBitIndex; rescanCount < rescanMarkCount; objectIndex++, bitIndex += objectBitDelta)
    {
        Assert(objectIndex < localObjectCount);
        Assert(!HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex)->Test(bitIndex));

        if (heapBlockMarkBits->Test(bitIndex))
        {
            char * objectAddress = blockStartAddress + objectIndex * localObjectSize;
            if (!TBlockType::RescanObject(block, objectAddress, localObjectSize, objectIndex, recycler))
            {
                // Failed to add to the mark stack due to OOM.
                return false;
            }

            rescanCount++;
        }
    }

    // Mark bits should not have changed during the Rescan
    if (startObjectAddress != pageAddress && lastObjectOnPreviousPageMarked)
    {
        Assert(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex) + 1);
    }
    else
    {
        Assert(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex));
    }

#if DBG
    // We stopped when we hit the rescanMarkCount.
    // Make sure no other objects were marked, otherwise our rescanMarkCount was wrong.
    for (uint i = objectIndex + 1; i < blockInfoForPage.lastObjectIndexOnPage; i++)
    {
        Assert(!heapBlockMarkBits->Test(i * objectBitDelta));
    }
#endif

    // Let the caller know if we rescanned anything on this page
    if (anyObjectRescanned != nullptr)
    {
        (*anyObjectRescanned) = (rescanCount > 0);
    }

    return true;
}